

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O3

void aom_highbd_quantize_b_32x32_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short sVar1;
  undefined1 auVar2 [32];
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  uint uVar35;
  uint *puVar36;
  ulong uVar37;
  int iVar38;
  uint uVar39;
  ushort uVar40;
  short *psVar41;
  long lVar42;
  long lVar43;
  int *piVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  uint local_168;
  uint local_164;
  undefined8 local_160;
  
  auVar46._8_2_ = 1;
  auVar46._0_8_ = 0x1000100010001;
  auVar46._10_2_ = 1;
  auVar46._12_2_ = 1;
  auVar46._14_2_ = 1;
  auVar46 = vpand_avx(ZEXT416(*(uint *)zbin_ptr),auVar46);
  auVar48 = vpsraw_avx(ZEXT416(*(uint *)zbin_ptr),1);
  auVar46 = vpaddw_avx(auVar46,auVar48);
  auVar46 = vpmovsxwd_avx(auVar46);
  local_160 = auVar46._0_8_;
  lVar42 = 0;
  puVar36 = &local_164;
  piVar44 = (int *)&local_160;
  bVar34 = true;
  do {
    bVar45 = bVar34;
    *puVar36 = ((dequant_ptr[lVar42] * 0x145 + 0x40 >> 7) + *piVar44 * 0x20) - 1;
    lVar42 = 1;
    puVar36 = &local_168;
    piVar44 = (int *)((long)&local_160 + 4);
    bVar34 = false;
  } while (bVar45);
  auVar47._4_4_ = local_168;
  auVar47._0_4_ = local_168;
  auVar47._8_4_ = local_168;
  auVar47._12_4_ = local_168;
  auVar47._16_4_ = local_168;
  auVar47._20_4_ = local_168;
  auVar47._24_4_ = local_168;
  auVar47._28_4_ = local_168;
  auVar59 = vpblendd_avx2(auVar47,ZEXT432(local_164),1);
  auVar50 = vpmovsxwd_avx2(*(undefined1 (*) [16])zbin_ptr);
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])round_ptr);
  auVar58 = vpcmpeqd_avx2(ZEXT432(local_164),ZEXT432(local_164));
  auVar50 = vpsubd_avx2(auVar50,auVar58);
  auVar68 = vpsubd_avx2(auVar62,auVar58);
  auVar65 = vpsrld_avx2(auVar50,1);
  auVar63 = vpaddd_avx2(auVar65,auVar58);
  auVar50 = vpabsd_avx2(*(undefined1 (*) [32])coeff_ptr);
  auVar62 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar57 = vpslld_avx2(auVar50,5);
  auVar59 = vpcmpgtd_avx2(auVar57,auVar59);
  auVar57 = vpslld_avx2(auVar62,5);
  auVar57 = vpcmpgtd_avx2(auVar57,auVar47);
  auVar59 = vpackssdw_avx2(auVar59,auVar57);
  auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar57 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar31 = (auVar59 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar59 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar59 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar59 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar59 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar59 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar59 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar59 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = (auVar59 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar21 = (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = (auVar59 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar59 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar59 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = SUB321(auVar59 >> 0x7f,0) != '\0';
  bVar16 = (auVar59 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar59 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = (auVar59 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar13 = (auVar59 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = (auVar59 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar59 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar59 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = SUB321(auVar59 >> 0xbf,0) != '\0';
  bVar8 = (auVar59 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar59 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = (auVar59 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar5 = (auVar59 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar4 = (auVar59 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar3 = (auVar59 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar45 = (auVar59 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = auVar59[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar31 || bVar32) || bVar30) || bVar29) || bVar28) || bVar27) ||
                              bVar26) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                        bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) ||
                 bVar13) || bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) ||
         bVar5) || bVar4) || bVar3) || bVar45) || bVar34) {
    auVar59 = vpermq_avx2(auVar59,0xd8);
    auVar57 = vpand_avx2(auVar59,*(undefined1 (*) [32])iscan);
  }
  bVar34 = ((((((((((((((((((((((((((((((bVar31 || bVar32) || bVar30) || bVar29) || bVar28) ||
                                    bVar27) || bVar26) || bVar25) || bVar24) || bVar23) || bVar22)
                              || bVar21) || bVar20) || bVar19) || bVar18) || bVar17) || bVar16) ||
                        bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar10) || bVar9) ||
                 bVar8) || bVar7) || bVar6) || bVar5) || bVar4) || bVar3) || bVar45) || bVar34;
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_ptr);
  auVar54 = vpmovsxwd_avx2(*(undefined1 (*) [16])dequant_ptr);
  auVar56 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_shift_ptr);
  auVar66 = vpsrld_avx2(auVar68,1);
  auVar68 = vpcmpgtd_avx2(auVar65,auVar50);
  auVar65 = vpermq_avx2(auVar63,0xee);
  auVar63 = vpcmpgtd_avx2(auVar62,auVar65);
  auVar59 = vpackssdw_avx2(auVar68 ^ auVar58,auVar63);
  bVar32 = (auVar59 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar33 = (auVar59 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar31 = (auVar59 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar30 = (auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar29 = (auVar59 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar28 = (auVar59 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar27 = (auVar59 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar26 = (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar25 = (auVar59 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar24 = (auVar59 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar23 = (auVar59 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar22 = (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar21 = (auVar59 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar20 = (auVar59 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar19 = (auVar59 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar18 = SUB321(auVar59 >> 0x7f,0) == '\0';
  bVar17 = (auVar59 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar16 = (auVar59 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar15 = (auVar59 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar14 = (auVar59 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar13 = (auVar59 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar12 = (auVar59 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar11 = (auVar59 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar10 = SUB321(auVar59 >> 0xbf,0) == '\0';
  bVar9 = (auVar59 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar8 = (auVar59 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar7 = (auVar59 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar6 = (auVar59 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar5 = (auVar59 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar4 = (auVar59 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar3 = (auVar59 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0;
  bVar45 = -1 < auVar59[0x1f];
  if (((((((((((((((((((((((((((((((bVar32 && bVar33) && bVar31) && bVar30) && bVar29) && bVar28) &&
                              bVar27) && bVar26) && bVar25) && bVar24) && bVar23) && bVar22) &&
                        bVar21) && bVar20) && bVar19) && bVar18) && bVar17) && bVar16) && bVar15) &&
                 bVar14) && bVar13) && bVar12) && bVar11) && bVar10) && bVar9) && bVar8) && bVar7)
         && bVar6) && bVar5) && bVar4) && bVar3) && bVar45) {
    auVar66 = vpermq_avx2(auVar66,0xee);
    auVar59 = vpermq_avx2(auVar67,0xee);
    auVar58 = vpermq_avx2(auVar56,0xee);
    auVar63 = vpermq_avx2(auVar54,0xee);
    auVar50 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar50;
    *(undefined1 (*) [32])qcoeff_ptr = auVar50;
    auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar49 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar59 = vpermq_avx2(auVar59,0xd8);
    auVar59 = vpand_avx2(auVar59,*(undefined1 (*) [32])iscan);
    auVar59 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar59);
    auVar49 = ZEXT3264(auVar59);
    auVar50 = vpaddd_avx2(auVar66,auVar50);
    auVar59 = vpmuldq_avx2(auVar50,auVar67);
    auVar58 = vpsrlq_avx2(auVar50,0x20);
    auVar61 = vpsrlq_avx2(auVar67,0x20);
    auVar58 = vpmuldq_avx2(auVar58,auVar61);
    auVar61 = vpsrlq_avx2(auVar59,0x10);
    auVar59 = vpsllq_avx2(auVar58,0x10);
    auVar59 = vpblendd_avx2(auVar61,auVar59,0xaa);
    auVar50 = vpaddd_avx2(auVar59,auVar50);
    auVar59 = vpmuldq_avx2(auVar50,auVar56);
    auVar50 = vpsrlq_avx2(auVar50,0x20);
    auVar58 = vpsrlq_avx2(auVar56,0x20);
    auVar50 = vpmuldq_avx2(auVar50,auVar58);
    auVar59 = vpsrlq_avx2(auVar59,0xf);
    auVar50 = vpsllq_avx2(auVar50,0x11);
    auVar2 = vpblendd_avx2(auVar59,auVar50,0xaa);
    auVar66 = vpermq_avx2(auVar66,0xee);
    auVar59 = vpermq_avx2(auVar67,0xee);
    auVar58 = vpermq_avx2(auVar56,0xee);
    auVar50 = vpaddd_avx2(auVar62,auVar66);
    auVar62 = vpmuldq_avx2(auVar50,auVar59);
    auVar61 = vpsrlq_avx2(auVar50,0x20);
    auVar67 = vpsrlq_avx2(auVar59,0x20);
    auVar61 = vpmuldq_avx2(auVar61,auVar67);
    auVar62 = vpsrlq_avx2(auVar62,0x10);
    auVar61 = vpsllq_avx2(auVar61,0x10);
    auVar62 = vpblendd_avx2(auVar62,auVar61,0xaa);
    auVar50 = vpaddd_avx2(auVar62,auVar50);
    auVar62 = vpmuldq_avx2(auVar50,auVar58);
    auVar50 = vpsrlq_avx2(auVar50,0x20);
    auVar61 = vpsrlq_avx2(auVar58,0x20);
    auVar50 = vpmuldq_avx2(auVar50,auVar61);
    auVar62 = vpsrlq_avx2(auVar62,0xf);
    auVar50 = vpsllq_avx2(auVar50,0x11);
    auVar62 = vpblendd_avx2(auVar62,auVar50,0xaa);
    auVar50 = vpsignd_avx2(auVar2,*(undefined1 (*) [32])coeff_ptr);
    auVar61 = vpsignd_avx2(auVar62,*(undefined1 (*) [32])(coeff_ptr + 8));
    auVar62 = vpandn_avx2(auVar68,auVar50);
    auVar68 = vpand_avx2(auVar63,auVar61);
    *(undefined1 (*) [32])qcoeff_ptr = auVar62;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar68;
    auVar50 = vpabsd_avx2(auVar62);
    auVar63 = vpmuldq_avx2(auVar50,auVar54);
    auVar50 = vpsrlq_avx2(auVar50,0x20);
    auVar61 = vpsrlq_avx2(auVar54,0x20);
    auVar50 = vpmuldq_avx2(auVar50,auVar61);
    auVar63 = vpsrlq_avx2(auVar63,1);
    auVar50 = vpsllq_avx2(auVar50,0x1f);
    auVar50 = vpblendd_avx2(auVar63,auVar50,0xaa);
    auVar50 = vpsignd_avx2(auVar50,auVar62);
    auVar63 = vpermq_avx2(auVar54,0xee);
    auVar62 = vpabsd_avx2(auVar68);
    auVar61 = vpmuldq_avx2(auVar62,auVar63);
    auVar62 = vpsrlq_avx2(auVar62,0x20);
    auVar67 = vpsrlq_avx2(auVar63,0x20);
    auVar62 = vpmuldq_avx2(auVar62,auVar67);
    auVar61 = vpsrlq_avx2(auVar61,1);
    auVar62 = vpsllq_avx2(auVar62,0x1f);
    auVar62 = vpblendd_avx2(auVar61,auVar62,0xaa);
    auVar62 = vpsignd_avx2(auVar62,auVar68);
    auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  bVar45 = ((((((((((((((((((((((((((((((!bVar32 || !bVar33) || !bVar31) || !bVar30) || !bVar29) ||
                                    !bVar28) || !bVar27) || !bVar26) || !bVar25) || !bVar24) ||
                               !bVar23) || !bVar22) || !bVar21) || !bVar20) || !bVar19) || !bVar18)
                         || !bVar17) || !bVar16) || !bVar15) || !bVar14) || !bVar13) || !bVar12) ||
                   !bVar11) || !bVar10) || !bVar9) || !bVar8) || !bVar7) || !bVar6) || !bVar5) ||
            !bVar4) || !bVar3) || !bVar45;
  auVar68 = auVar49._0_32_;
  auVar57 = vpmaxsw_avx2(auVar57,auVar61);
  auVar60 = ZEXT3264(auVar57);
  *(undefined1 (*) [32])dqcoeff_ptr = auVar50;
  *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar62;
  if (0x10 < n_coeffs) {
    auVar62 = vpsrad_avx2(auVar59,0x1f);
    auVar50 = vpshufd_avx2(auVar59,0xf5);
    auVar62 = vpblendd_avx2(auVar50,auVar62,0xaa);
    auVar57 = vpsrad_avx2(auVar58,0x1f);
    auVar50 = vpshufd_avx2(auVar58,0xf5);
    auVar61 = vpblendd_avx2(auVar50,auVar57,0xaa);
    auVar57 = vpsrad_avx2(auVar63,0x1f);
    auVar50 = vpshufd_avx2(auVar63,0xf5);
    auVar50 = vpblendd_avx2(auVar50,auVar57,0xaa);
    iVar38 = 0x10;
    lVar42 = 0x10;
    bVar3 = bVar45;
    do {
      bVar45 = bVar3;
      lVar43 = (long)iVar38;
      while( true ) {
        iVar38 = iVar38 + 0x10;
        auVar67 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar42));
        auVar54 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar42 + 8));
        auVar57 = vpslld_avx2(auVar67,5);
        auVar57 = vpcmpgtd_avx2(auVar57,auVar47);
        auVar68 = vpslld_avx2(auVar54,5);
        auVar68 = vpcmpgtd_avx2(auVar68,auVar47);
        auVar57 = vpackssdw_avx2(auVar57,auVar68);
        if ((((((((((((((((((((((((((((((((auVar57 >> 7 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0 &&
                                         (auVar57 >> 0xf & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar57 >> 0x17 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar57 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar57 >> 0x27 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar57 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar57 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar57 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar57 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar57 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar57 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar57 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar57 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar57 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar57 >> 0x7f,0) == '\0') &&
                          (auVar57 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar57 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar57 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar57 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar57 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar57 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar57 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar57 >> 0xbf,0) == '\0') &&
                  (auVar57 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar57 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar57 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar57 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar57 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar57 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar57 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            -1 < auVar57[0x1f]) {
          auVar57 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        }
        else {
          auVar57 = vpermq_avx2(auVar57,0xd8);
          auVar57 = vpand_avx2(auVar57,*(undefined1 (*) [32])(iscan + lVar42));
          bVar34 = true;
        }
        auVar57 = vpmaxsw_avx2(auVar57,auVar60._0_32_);
        auVar60 = ZEXT3264(auVar57);
        auVar56 = vpcmpgtd_avx2(auVar67,auVar65);
        auVar2 = vpcmpgtd_avx2(auVar54,auVar65);
        auVar68 = vpackssdw_avx2(auVar56,auVar2);
        if ((((((((((((((((((((((((((((((((auVar68 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar68 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar68 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar68 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar68 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar68 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar68 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar68 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar68 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar68 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar68 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar68 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar68 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar68 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar68 >> 0x7f,0) != '\0') ||
                          (auVar68 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar68 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar68 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar68 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar68 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar68 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0xbf,0) != '\0') ||
                  (auVar68 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar68 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar68 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar68 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar68 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar68 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar68 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar68[0x1f] < '\0') break;
        auVar67 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar68 = vpmaxsw_avx2(auVar67,auVar49._0_32_);
        auVar49 = ZEXT3264(auVar68);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar42 + 8) = auVar67;
        *(undefined1 (*) [32])(qcoeff_ptr + lVar42) = auVar67;
        lVar43 = lVar43 + 0x10;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar42 + 8) = auVar67;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar42) = auVar67;
        lVar42 = lVar43;
        if (n_coeffs <= lVar43) goto LAB_0037accc;
      }
      auVar68 = vpermq_avx2(auVar68,0xd8);
      auVar68 = vpand_avx2(auVar68,*(undefined1 (*) [32])(iscan + lVar42));
      auVar68 = vpmaxsw_avx2(auVar68,auVar49._0_32_);
      auVar49 = ZEXT3264(auVar68);
      auVar67 = vpaddd_avx2(auVar67,auVar66);
      auVar55 = vpmuldq_avx2(auVar67,auVar59);
      auVar64 = vpsrad_avx2(auVar67,0x1f);
      auVar53 = vpshufd_avx2(auVar67,0xf5);
      auVar51 = vpsrlq_avx2(auVar62,0x20);
      auVar52 = vpmuludq_avx2(auVar53,auVar51);
      auVar64 = vpsrlq_avx2(auVar64,0x20);
      auVar64 = vpmuludq_avx2(auVar64,auVar62);
      auVar52 = vpaddq_avx2(auVar64,auVar52);
      auVar64 = vpsllq_avx2(auVar52,0x20);
      auVar52 = vpmuludq_avx2(auVar62,auVar53);
      auVar52 = vpaddq_avx2(auVar52,auVar64);
      auVar55 = vpsrlq_avx2(auVar55,0x10);
      auVar52 = vpsllq_avx2(auVar52,0x10);
      auVar52 = vpblendd_avx2(auVar55,auVar52,0xaa);
      auVar67 = vpaddd_avx2(auVar67,auVar52);
      auVar55 = vpsrad_avx2(auVar67,0x1f);
      auVar64 = vpshufd_avx2(auVar67,0xf5);
      auVar53 = vpsrlq_avx2(auVar61,0x20);
      auVar52 = vpmuludq_avx2(auVar64,auVar53);
      auVar55 = vpsrlq_avx2(auVar55,0x20);
      auVar55 = vpmuludq_avx2(auVar61,auVar55);
      auVar52 = vpaddq_avx2(auVar52,auVar55);
      auVar55 = vpmuldq_avx2(auVar67,auVar58);
      auVar52 = vpsllq_avx2(auVar52,0x20);
      auVar67 = vpmuludq_avx2(auVar64,auVar61);
      auVar67 = vpaddq_avx2(auVar67,auVar52);
      auVar52 = vpsrlq_avx2(auVar55,0xf);
      auVar67 = vpsllq_avx2(auVar67,0x11);
      auVar64 = vpblendd_avx2(auVar52,auVar67,0xaa);
      auVar67 = vpaddd_avx2(auVar54,auVar66);
      auVar52 = vpsrad_avx2(auVar67,0x1f);
      auVar55 = vpshufd_avx2(auVar67,0xf5);
      auVar54 = vpmuludq_avx2(auVar55,auVar51);
      auVar52 = vpsrlq_avx2(auVar52,0x20);
      auVar52 = vpmuludq_avx2(auVar62,auVar52);
      auVar54 = vpaddq_avx2(auVar54,auVar52);
      auVar52 = vpsllq_avx2(auVar54,0x20);
      auVar54 = vpmuludq_avx2(auVar55,auVar62);
      auVar54 = vpaddq_avx2(auVar54,auVar52);
      auVar52 = vpmuldq_avx2(auVar67,auVar59);
      auVar52 = vpsrlq_avx2(auVar52,0x10);
      auVar54 = vpsllq_avx2(auVar54,0x10);
      auVar54 = vpblendd_avx2(auVar52,auVar54,0xaa);
      auVar67 = vpaddd_avx2(auVar54,auVar67);
      auVar52 = vpsrad_avx2(auVar67,0x1f);
      auVar55 = vpshufd_avx2(auVar67,0xf5);
      auVar54 = vpmuludq_avx2(auVar55,auVar53);
      auVar52 = vpsrlq_avx2(auVar52,0x20);
      auVar52 = vpmuludq_avx2(auVar61,auVar52);
      auVar54 = vpaddq_avx2(auVar54,auVar52);
      auVar52 = vpsllq_avx2(auVar54,0x20);
      auVar54 = vpmuludq_avx2(auVar61,auVar55);
      auVar54 = vpaddq_avx2(auVar54,auVar52);
      auVar67 = vpmuldq_avx2(auVar67,auVar58);
      auVar67 = vpsrlq_avx2(auVar67,0xf);
      auVar54 = vpsllq_avx2(auVar54,0x11);
      auVar54 = vpblendd_avx2(auVar67,auVar54,0xaa);
      auVar67 = vpsignd_avx2(auVar64,*(undefined1 (*) [32])(coeff_ptr + lVar42));
      auVar54 = vpsignd_avx2(auVar54,*(undefined1 (*) [32])(coeff_ptr + lVar42 + 8));
      auVar56 = vpand_avx2(auVar56,auVar67);
      auVar2 = vpand_avx2(auVar2,auVar54);
      auVar67 = vpabsd_avx2(auVar56);
      auVar52 = vpsrad_avx2(auVar67,0x1f);
      auVar55 = vpshufd_avx2(auVar67,0xf5);
      auVar64 = vpsrlq_avx2(auVar50,0x20);
      auVar54 = vpmuludq_avx2(auVar55,auVar64);
      auVar52 = vpsrlq_avx2(auVar52,0x20);
      auVar52 = vpmuludq_avx2(auVar50,auVar52);
      auVar54 = vpaddq_avx2(auVar54,auVar52);
      *(undefined1 (*) [32])(qcoeff_ptr + lVar42) = auVar56;
      auVar52 = vpmuldq_avx2(auVar67,auVar63);
      auVar54 = vpsllq_avx2(auVar54,0x20);
      auVar67 = vpmuludq_avx2(auVar55,auVar50);
      auVar67 = vpaddq_avx2(auVar67,auVar54);
      auVar54 = vpsrlq_avx2(auVar52,1);
      auVar67 = vpsllq_avx2(auVar67,0x1f);
      auVar67 = vpblendd_avx2(auVar54,auVar67,0xaa);
      auVar55 = vpsignd_avx2(auVar67,auVar56);
      auVar67 = vpabsd_avx2(auVar2);
      auVar56 = vpsrad_avx2(auVar67,0x1f);
      auVar52 = vpshufd_avx2(auVar67,0xf5);
      auVar54 = vpmuludq_avx2(auVar52,auVar64);
      auVar56 = vpsrlq_avx2(auVar56,0x20);
      auVar56 = vpmuludq_avx2(auVar50,auVar56);
      auVar54 = vpaddq_avx2(auVar54,auVar56);
      auVar56 = vpsllq_avx2(auVar54,0x20);
      auVar54 = vpmuludq_avx2(auVar52,auVar50);
      auVar54 = vpaddq_avx2(auVar54,auVar56);
      auVar67 = vpmuldq_avx2(auVar67,auVar63);
      auVar67 = vpsrlq_avx2(auVar67,1);
      auVar54 = vpsllq_avx2(auVar54,0x1f);
      auVar67 = vpblendd_avx2(auVar67,auVar54,0xaa);
      *(undefined1 (*) [32])(qcoeff_ptr + lVar42 + 8) = auVar2;
      auVar67 = vpsignd_avx2(auVar67,auVar2);
      *(undefined1 (*) [32])(dqcoeff_ptr + lVar42) = auVar55;
      *(undefined1 (*) [32])(dqcoeff_ptr + lVar42 + 8) = auVar67;
      lVar42 = (long)iVar38;
      bVar45 = true;
      bVar3 = true;
    } while (lVar42 < n_coeffs);
  }
LAB_0037accc:
  if (bVar34) {
    auVar46 = vpmaxsw_avx(auVar57._0_16_,auVar57._16_16_);
    auVar48 = vpshufd_avx(auVar46,0xee);
    auVar46 = vpmaxsw_avx(auVar48,auVar46);
    auVar48 = vpshufd_avx(auVar46,1);
    auVar46 = vpmaxsw_avx(auVar48,auVar46);
    auVar48 = vpsrld_avx(auVar46,0x10);
    auVar46 = vpmaxsw_avx(auVar46,auVar48);
    iVar38 = vpextrw_avx(auVar46,0);
    uVar39 = iVar38 + 1;
  }
  else {
    uVar39 = 0;
  }
  if (bVar45) {
    auVar46 = vpmaxsw_avx(auVar68._0_16_,auVar68._16_16_);
    auVar48 = vpshufd_avx(auVar46,0xee);
    auVar46 = vpmaxsw_avx(auVar48,auVar46);
    auVar48 = vpshufd_avx(auVar46,1);
    auVar46 = vpmaxsw_avx(auVar48,auVar46);
    auVar48 = vpsrld_avx(auVar46,0x10);
    auVar46 = vpmaxsw_avx(auVar46,auVar48);
    uVar35 = vpextrw_avx(auVar46,0);
  }
  else {
    uVar35 = 0xffffffff;
  }
  if ((int)uVar39 <= (int)uVar35) {
    iVar38 = uVar35 + 1;
    psVar41 = scan + uVar35;
    do {
      sVar1 = *psVar41;
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      iVar38 = iVar38 + -1;
      psVar41 = psVar41 + -1;
    } while ((int)uVar39 < iVar38);
  }
  iVar38 = uVar39 + 1;
  uVar37 = (ulong)uVar39;
  do {
    if ((long)uVar37 < 1) {
      uVar40 = 0;
      break;
    }
    lVar42 = uVar37 - 1;
    uVar37 = uVar37 - 1;
    iVar38 = iVar38 + -1;
    uVar40 = (ushort)iVar38;
  } while (qcoeff_ptr[scan[lVar42]] == 0);
  *eob_ptr = uVar40;
  uVar35 = 0xffffffff;
  if (uVar39 != 0) {
    uVar37 = 0;
    do {
      if (qcoeff_ptr[scan[uVar37]] != 0) {
        uVar35 = (uint)uVar37;
        break;
      }
      uVar37 = uVar37 + 1;
    } while (uVar39 != uVar37);
  }
  if ((uVar40 != 0) && (uVar35 == uVar40 - 1)) {
    sVar1 = scan[uVar35];
    if (((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) &&
       (uVar39 = coeff_ptr[sVar1] >> 0x1f,
       (int)((coeff_ptr[sVar1] << 5 ^ uVar39) - uVar39) <
       *(int *)((long)&local_160 + (ulong)(sVar1 != 0) * 4) * 0x20 +
       (dequant_ptr[sVar1 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar1] = 0;
      dqcoeff_ptr[sVar1] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const int log_scale = 1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  const __m256i one = _mm256_set1_epi32(1);
  const __m256i log_scale_vec = _mm256_set1_epi32(log_scale);
  int prescan_add[2];
  int thresh[2];
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  zbin = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)zbin_ptr));
  round = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)round_ptr));
  quant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_ptr));
  dequant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)dequant_ptr));
  shift =
      _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_shift_ptr));

  // Shift with rounding.
  zbin = _mm256_add_epi32(zbin, log_scale_vec);
  round = _mm256_add_epi32(round, log_scale_vec);
  zbin = _mm256_srli_epi32(zbin, log_scale);
  round = _mm256_srli_epi32(round, log_scale);
  zbin = _mm256_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_permute2x128_si256(zbin, zbin, 0x11);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}